

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O2

void Aig_RManPrintVarProfile(uint *pTruth,int nVars,uint *pTruthAux)

{
  ulong uVar1;
  ulong uVar2;
  int pStore2 [32];
  
  uVar1 = (ulong)(uint)nVars;
  Kit_TruthCountOnesInCofsSlow(pTruth,nVars,pStore2,pTruthAux);
  if (nVars < 1) {
    uVar1 = 0;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    printf("%2d/%2d ",(ulong)(uint)pStore2[uVar2 * 2],(ulong)(uint)pStore2[uVar2 * 2 + 1]);
  }
  putchar(10);
  return;
}

Assistant:

void Aig_RManPrintVarProfile( unsigned * pTruth, int nVars,  unsigned * pTruthAux )
{
    int pStore2[32];
    int i;
    Kit_TruthCountOnesInCofsSlow( pTruth, nVars, pStore2, pTruthAux );
    for ( i = 0; i < nVars; i++ )
        printf( "%2d/%2d ", pStore2[2*i], pStore2[2*i+1] );
    printf( "\n" );
}